

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O1

int alsa_stream_get_latency(cubeb_stream_conflict1 *stm,uint32_t *latency)

{
  int iVar1;
  int iVar2;
  snd_pcm_sframes_t delay;
  uint32_t local_10 [2];
  
  iVar1 = (*cubeb_snd_pcm_delay)(stm->pcm,(snd_pcm_sframes_t *)local_10);
  iVar2 = -1;
  if (iVar1 == 0) {
    *latency = local_10[0];
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
alsa_stream_get_latency(cubeb_stream * stm, uint32_t * latency)
{
  snd_pcm_sframes_t delay;
  /* This function returns the delay in frames until a frame written using
     snd_pcm_writei is sent to the DAC. The DAC delay should be < 1ms anyways. */
  if (WRAP(snd_pcm_delay)(stm->pcm, &delay)) {
    return CUBEB_ERROR;
  }

  *latency = delay;

  return CUBEB_OK;
}